

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__read_and_decode_next_flac_frame(ma_dr_flac *pFlac)

{
  ma_bool32 mVar1;
  ma_result mVar2;
  ma_result result;
  ma_dr_flac *unaff_retaddr;
  ma_dr_flac_frame_header *in_stack_00000110;
  ma_uint8 in_stack_0000011f;
  ma_dr_flac_bs *in_stack_00000120;
  
  while( true ) {
    mVar1 = ma_dr_flac__read_next_flac_frame_header
                      (in_stack_00000120,in_stack_0000011f,in_stack_00000110);
    if (mVar1 == 0) {
      return 0;
    }
    mVar2 = ma_dr_flac__decode_flac_frame(unaff_retaddr);
    if (mVar2 == MA_SUCCESS) break;
    if (mVar2 != MA_CRC_MISMATCH) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static ma_bool32 ma_dr_flac__read_and_decode_next_flac_frame(ma_dr_flac* pFlac)
{
    MA_DR_FLAC_ASSERT(pFlac != NULL);
    for (;;) {
        ma_result result;
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
        result = ma_dr_flac__decode_flac_frame(pFlac);
        if (result != MA_SUCCESS) {
            if (result == MA_CRC_MISMATCH) {
                continue;
            } else {
                return MA_FALSE;
            }
        }
        return MA_TRUE;
    }
}